

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# specreaderimpl.cpp
# Opt level: O0

void __thiscall
apngasm::spec::priv::AbstractSpecReaderImpl::AbstractSpecReaderImpl(AbstractSpecReaderImpl *this)

{
  allocator<char> local_11;
  AbstractSpecReaderImpl *local_10;
  AbstractSpecReaderImpl *this_local;
  
  local_10 = this;
  ISpecReaderImpl::ISpecReaderImpl(&this->super_ISpecReaderImpl);
  (this->super_ISpecReaderImpl)._vptr_ISpecReaderImpl =
       (_func_int **)&PTR__AbstractSpecReaderImpl_0026bf10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->_name,"",&local_11);
  std::allocator<char>::~allocator(&local_11);
  this->_loops = 0;
  this->_skipFirst = false;
  memset(&this->_frameInfos,0,0x18);
  std::vector<apngasm::spec::priv::FrameInfo,_std::allocator<apngasm::spec::priv::FrameInfo>_>::
  vector(&this->_frameInfos);
  return;
}

Assistant:

AbstractSpecReaderImpl::AbstractSpecReaderImpl()
        : _name("")
        , _loops(0)
        , _skipFirst(false)
        , _frameInfos()
      {
        // nop
      }